

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_perform_mail(connectdata *conn)

{
  Curl_easy *pCVar1;
  char *pcVar2;
  curl_off_t cVar3;
  Curl_easy *data;
  char *pcStack_30;
  CURLcode result;
  char *size;
  char *auth;
  char *from;
  connectdata *conn_local;
  
  size = (char *)0x0;
  pcStack_30 = (char *)0x0;
  pCVar1 = conn->data;
  if ((pCVar1->set).str[0x33] == (char *)0x0) {
    auth = (*Curl_cstrdup)("<>");
  }
  else if (*(pCVar1->set).str[0x33] == '<') {
    auth = curl_maprintf("%s",(pCVar1->set).str[0x33]);
  }
  else {
    auth = curl_maprintf("<%s>",(pCVar1->set).str[0x33]);
  }
  if (auth == (char *)0x0) {
    conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    if (((pCVar1->set).str[0x34] != (char *)0x0) && ((conn->proto).ftpc.cwdcount != 0)) {
      if (*(pCVar1->set).str[0x34] == '\0') {
        size = (*Curl_cstrdup)("<>");
      }
      else {
        size = curl_maprintf("%s",(pCVar1->set).str[0x34]);
      }
      if (size == (char *)0x0) {
        (*Curl_cfree)(auth);
        return CURLE_OUT_OF_MEMORY;
      }
    }
    if ((pCVar1->set).mimepost.kind != MIMEKIND_NONE) {
      (pCVar1->set).mimepost.flags = (pCVar1->set).mimepost.flags & 0xfffffffd;
      curl_mime_headers(&(pCVar1->set).mimepost,(pCVar1->set).headers,0);
      data._4_4_ = Curl_mime_prepare_headers
                             (&(pCVar1->set).mimepost,(char *)0x0,(char *)0x0,MIMESTRATEGY_MAIL);
      if ((data._4_4_ == CURLE_OK) &&
         (pcVar2 = Curl_checkheaders(conn,"Mime-Version"), pcVar2 == (char *)0x0)) {
        data._4_4_ = Curl_mime_add_header(&(pCVar1->set).mimepost.curlheaders,"Mime-Version: 1.0");
      }
      if (data._4_4_ == CURLE_OK) {
        data._4_4_ = Curl_mime_rewind(&(pCVar1->set).mimepost);
      }
      if (data._4_4_ != CURLE_OK) {
        (*Curl_cfree)(auth);
        (*Curl_cfree)(size);
        return data._4_4_;
      }
      cVar3 = Curl_mime_size(&(pCVar1->set).mimepost);
      (pCVar1->state).infilesize = cVar3;
      (pCVar1->state).fread_func = Curl_mime_read;
      (pCVar1->state).in = &(pCVar1->set).mimepost;
    }
    if (((((conn->proto).imapc.resptag[1] & 1U) == 0) || ((pCVar1->state).infilesize < 1)) ||
       (pcStack_30 = curl_maprintf("%ld",(pCVar1->state).infilesize), pcStack_30 != (char *)0x0)) {
      if ((size == (char *)0x0) && (pcStack_30 == (char *)0x0)) {
        data._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"MAIL FROM:%s",auth);
      }
      else if ((size == (char *)0x0) || (pcStack_30 != (char *)0x0)) {
        if ((size == (char *)0x0) || (pcStack_30 == (char *)0x0)) {
          data._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"MAIL FROM:%s SIZE=%s",auth,pcStack_30);
        }
        else {
          data._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"MAIL FROM:%s AUTH=%s SIZE=%s",auth,size
                                     ,pcStack_30);
        }
      }
      else {
        data._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"MAIL FROM:%s AUTH=%s",auth,size);
      }
      (*Curl_cfree)(auth);
      (*Curl_cfree)(size);
      (*Curl_cfree)(pcStack_30);
      if (data._4_4_ == CURLE_OK) {
        state(conn,SMTP_MAIL);
      }
      conn_local._4_4_ = data._4_4_;
    }
    else {
      (*Curl_cfree)(auth);
      (*Curl_cfree)(size);
      conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode smtp_perform_mail(struct connectdata *conn)
{
  char *from = NULL;
  char *auth = NULL;
  char *size = NULL;
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;

  /* Calculate the FROM parameter */
  if(!data->set.str[STRING_MAIL_FROM])
    /* Null reverse-path, RFC-5321, sect. 3.6.3 */
    from = strdup("<>");
  else if(data->set.str[STRING_MAIL_FROM][0] == '<')
    from = aprintf("%s", data->set.str[STRING_MAIL_FROM]);
  else
    from = aprintf("<%s>", data->set.str[STRING_MAIL_FROM]);

  if(!from)
    return CURLE_OUT_OF_MEMORY;

  /* Calculate the optional AUTH parameter */
  if(data->set.str[STRING_MAIL_AUTH] && conn->proto.smtpc.sasl.authused) {
    if(data->set.str[STRING_MAIL_AUTH][0] != '\0')
      auth = aprintf("%s", data->set.str[STRING_MAIL_AUTH]);
    else
      /* Empty AUTH, RFC-2554, sect. 5 */
      auth = strdup("<>");

    if(!auth) {
      free(from);

      return CURLE_OUT_OF_MEMORY;
    }
  }

  /* Prepare the mime data if some. */
  if(data->set.mimepost.kind != MIMEKIND_NONE) {
    /* Use the whole structure as data. */
    data->set.mimepost.flags &= ~MIME_BODY_ONLY;

    /* Add external headers and mime version. */
    curl_mime_headers(&data->set.mimepost, data->set.headers, 0);
    result = Curl_mime_prepare_headers(&data->set.mimepost, NULL,
                                       NULL, MIMESTRATEGY_MAIL);

    if(!result)
      if(!Curl_checkheaders(conn, "Mime-Version"))
        result = Curl_mime_add_header(&data->set.mimepost.curlheaders,
                                      "Mime-Version: 1.0");

    /* Make sure we will read the entire mime structure. */
    if(!result)
      result = Curl_mime_rewind(&data->set.mimepost);

    if(result) {
      free(from);
      free(auth);
      return result;
    }

    data->state.infilesize = Curl_mime_size(&data->set.mimepost);

    /* Read from mime structure. */
    data->state.fread_func = (curl_read_callback) Curl_mime_read;
    data->state.in = (void *) &data->set.mimepost;
  }

  /* Calculate the optional SIZE parameter */
  if(conn->proto.smtpc.size_supported && data->state.infilesize > 0) {
    size = aprintf("%" CURL_FORMAT_CURL_OFF_T, data->state.infilesize);

    if(!size) {
      free(from);
      free(auth);

      return CURLE_OUT_OF_MEMORY;
    }
  }

  /* Send the MAIL command */
  if(!auth && !size)
    result = Curl_pp_sendf(&conn->proto.smtpc.pp,
                           "MAIL FROM:%s", from);
  else if(auth && !size)
    result = Curl_pp_sendf(&conn->proto.smtpc.pp,
                           "MAIL FROM:%s AUTH=%s", from, auth);
  else if(auth && size)
    result = Curl_pp_sendf(&conn->proto.smtpc.pp,
                           "MAIL FROM:%s AUTH=%s SIZE=%s", from, auth, size);
  else
    result = Curl_pp_sendf(&conn->proto.smtpc.pp,
                           "MAIL FROM:%s SIZE=%s", from, size);

  free(from);
  free(auth);
  free(size);

  if(!result)
    state(conn, SMTP_MAIL);

  return result;
}